

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool BeginChildEx(char *name,ImGuiID id,ImVec2 *size_arg,bool border,ImGuiWindowFlags extra_flags)

{
  uint uVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiWindow *pIVar5;
  uint uVar6;
  float fVar7;
  ImGuiWindow *child_window;
  char local_158 [7];
  bool ret;
  char title [256];
  float backup_border_size;
  int auto_fit_axises;
  ImVec2 size;
  ImVec2 content_avail;
  ImGuiWindowFlags flags;
  ImGuiWindow *parent_window;
  ImGuiContext *g;
  ImGuiWindowFlags extra_flags_local;
  bool border_local;
  ImVec2 *size_arg_local;
  ImGuiID id_local;
  char *name_local;
  
  pIVar3 = GImGui;
  pIVar5 = ImGui::GetCurrentWindow();
  uVar1 = pIVar5->Flags;
  size = ImGui::GetContentRegionAvail();
  _backup_border_size = ImFloor(size_arg);
  bVar2 = backup_border_size == 0.0;
  uVar6 = 0;
  if ((float)auto_fit_axises == 0.0) {
    uVar6 = 2;
  }
  if (backup_border_size <= 0.0) {
    fVar7 = ImMax<float>(size.x + backup_border_size,4.0);
    backup_border_size = fVar7;
  }
  if ((float)auto_fit_axises <= 0.0) {
    fVar7 = ImMax<float>(size.y + (float)auto_fit_axises,4.0);
    auto_fit_axises = (int)fVar7;
  }
  title._252_4_ = (pIVar3->Style).ChildBorderSize;
  if (!border) {
    (pIVar3->Style).ChildBorderSize = 0.0;
  }
  if (name == (char *)0x0) {
    ImFormatString(local_158,0x100,"%s/%08X",pIVar5->Name,(ulong)id);
  }
  else {
    ImFormatString(local_158,0x100,"%s/%s",pIVar5->Name,name);
  }
  ImGui::SetNextWindowSize((ImVec2 *)&backup_border_size,0);
  bVar4 = ImGui::Begin(local_158,(bool *)0x0,extra_flags | uVar1 & 4 | 0x1000103);
  pIVar5 = ImGui::GetCurrentWindow();
  pIVar5->ChildId = id;
  pIVar5->AutoFitChildAxises = bVar2 | uVar6;
  (pIVar3->Style).ChildBorderSize = (float)title._252_4_;
  if (((extra_flags & 0x800000U) == 0) &&
     ((((pIVar5->DC).NavLayerActiveMask != 0 || (((pIVar5->DC).NavHasScroll & 1U) != 0)) &&
      (pIVar3->NavActivateId == id)))) {
    ImGui::FocusWindow(pIVar5);
    ImGui::NavInitWindow(pIVar5,false);
    ImGui::SetActiveID(id + 1,pIVar5);
    pIVar3->ActiveIdSource = ImGuiInputSource_Nav;
  }
  return bVar4;
}

Assistant:

static bool BeginChildEx(const char* name, ImGuiID id, const ImVec2& size_arg, bool border, ImGuiWindowFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = ImGui::GetCurrentWindow();
    ImGuiWindowFlags flags = ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoResize|ImGuiWindowFlags_NoSavedSettings|ImGuiWindowFlags_ChildWindow;
    flags |= (parent_window->Flags & ImGuiWindowFlags_NoMove);  // Inherit the NoMove flag

    const ImVec2 content_avail = ImGui::GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    const int auto_fit_axises = ((size.x == 0.0f) ? (1 << ImGuiAxis_X) : 0x00) | ((size.y == 0.0f) ? (1 << ImGuiAxis_Y) : 0x00);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too much issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);

    const float backup_border_size = g.Style.ChildBorderSize;
    if (!border)
        g.Style.ChildBorderSize = 0.0f;
    flags |= extra_flags;

    char title[256];
    if (name)
        ImFormatString(title, IM_ARRAYSIZE(title), "%s/%s", parent_window->Name, name);
    else
        ImFormatString(title, IM_ARRAYSIZE(title), "%s/%08X", parent_window->Name, id);

    ImGui::SetNextWindowSize(size);
    bool ret = ImGui::Begin(title, NULL, flags);
    ImGuiWindow* child_window = ImGui::GetCurrentWindow();
    child_window->ChildId = id;
    child_window->AutoFitChildAxises = auto_fit_axises;
    g.Style.ChildBorderSize = backup_border_size;

    // Process navigation-in immediately so NavInit can run on first frame
    if (!(flags & ImGuiWindowFlags_NavFlattened) && (child_window->DC.NavLayerActiveMask != 0 || child_window->DC.NavHasScroll) && g.NavActivateId == id)
    {
        ImGui::FocusWindow(child_window);
        ImGui::NavInitWindow(child_window, false);
        ImGui::SetActiveID(id+1, child_window); // Steal ActiveId with a dummy id so that key-press won't activate child item
        g.ActiveIdSource = ImGuiInputSource_Nav;
    }

    return ret;
}